

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool despot::Variable::IsVariablePrevName
               (string *name,vector<despot::StateVar,_std::allocator<despot::StateVar>_> *vars)

{
  long lVar1;
  pointer pSVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  size_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pSVar2 = (vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    lVar4 = lVar4 >> 6;
    uVar6 = lVar4 * -0x5555555555555555;
    __n = name->_M_string_length;
    psVar5 = &(pSVar2->prev_name_)._M_string_length;
    uVar7 = 1;
    do {
      if (__n == *psVar5) {
        if (__n == 0) {
          return bVar8;
        }
        iVar3 = bcmp((name->_M_dataplus)._M_p,(((string *)(psVar5 + -1))->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return bVar8;
        }
      }
      bVar8 = uVar7 <= uVar6 && uVar6 - uVar7 != 0;
      psVar5 = psVar5 + 0x18;
      lVar1 = uVar7 + (lVar4 * 0x5555555555555555 - (ulong)(uVar6 == 0));
      uVar7 = uVar7 + 1;
    } while (lVar1 != 0);
  }
  return bVar8;
}

Assistant:

bool Variable::IsVariablePrevName(string name, const vector<StateVar>& vars) {
	for (int i = 0; i < vars.size(); i++) {
		const StateVar& var = vars[i];
		if (name == var.prev_name())
			return true;
	}
	return false;
}